

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVector<slang::ast::EvalContext::Frame,_2UL>::SmallVector
          (SmallVector<slang::ast::EvalContext::Frame,_2UL> *this,Base *other)

{
  (this->super_SmallVectorBase<slang::ast::EvalContext::Frame>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::ast::EvalContext::Frame>).firstElement;
  (this->super_SmallVectorBase<slang::ast::EvalContext::Frame>).len = 0;
  (this->super_SmallVectorBase<slang::ast::EvalContext::Frame>).cap = 2;
  SmallVectorBase<slang::ast::EvalContext::Frame>::append<const_slang::ast::EvalContext::Frame_*>
            (&this->super_SmallVectorBase<slang::ast::EvalContext::Frame>,other->data_,
             other->data_ + other->len);
  return;
}

Assistant:

SmallVector(const Base& other) : Base(N) { this->append(other.begin(), other.end()); }